

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_draw_text<unsigned_char,unsigned_char,unsigned_char>
          (CImg<unsigned_char> *this,int x0,int y0,char *text,uchar *foreground_color,
          uchar *background_color,float opacity,CImgList<unsigned_char> *font,bool is_native_font)

{
  byte bVar1;
  uchar value;
  undefined4 uVar2;
  size_t sVar3;
  CImg<unsigned_char> *pCVar4;
  CImgArgumentException *this_00;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  char *pcVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  CImg<unsigned_char> letter;
  CImg<unsigned_char> local_50;
  
  if (text == (char *)0x0) {
    return this;
  }
  pCVar4 = font->_data;
  if (pCVar4 != (CImg<unsigned_char> *)0x0) {
    sVar3 = strlen(text);
    if ((this->_data == (uchar *)0x0) ||
       (auVar14._0_4_ = -(uint)(this->_width == 0), auVar14._4_4_ = -(uint)(this->_height == 0),
       auVar14._8_4_ = -(uint)(this->_depth == 0), auVar14._12_4_ = -(uint)(this->_spectrum == 0),
       uVar2 = movmskps((int)this,auVar14), (char)uVar2 != '\0')) {
      if ((int)sVar3 == 0) {
        iVar7 = 0;
        iVar6 = 0;
        iVar9 = 0;
        bVar13 = false;
      }
      else {
        uVar11 = 0;
        iVar9 = 0;
        iVar6 = 0;
        iVar7 = 0;
        do {
          bVar1 = text[uVar11];
          if (bVar1 == 9) {
            iVar7 = iVar7 + pCVar4[0x20]._width * 4;
          }
          else if (bVar1 == 10) {
            iVar6 = iVar6 + pCVar4->_height;
            if (iVar9 < iVar7) {
              iVar9 = iVar7;
            }
            iVar7 = 0;
          }
          else if ((uint)bVar1 < font->_width) {
            iVar7 = iVar7 + pCVar4[bVar1]._width;
          }
          uVar11 = uVar11 + 1;
        } while ((sVar3 & 0xffffffff) != uVar11);
        bVar13 = bVar1 == 10;
      }
      if ((iVar7 != 0) || (bVar13)) {
        if (iVar9 < iVar7) {
          iVar9 = iVar7;
        }
        iVar6 = iVar6 + pCVar4->_height;
      }
      uVar10 = 1;
      if (!is_native_font) {
        uVar10 = pCVar4->_spectrum;
      }
      pCVar4 = assign(this,iVar9 + x0,iVar6 + y0,1,uVar10);
      fill(pCVar4,'\0');
    }
    if ((int)sVar3 != 0) {
      uVar11 = 0;
      iVar7 = x0;
      do {
        bVar1 = text[uVar11];
        if (bVar1 == 9) {
          iVar7 = iVar7 + font->_data[0x20]._width * 4;
        }
        else if (bVar1 == 10) {
          y0 = y0 + font->_data->_height;
          iVar7 = x0;
        }
        else if ((uint)bVar1 < font->_width) {
          CImg(&letter,font->_data + bVar1);
          if (letter._data != (uchar *)0x0) {
            uVar10 = this->_spectrum;
            if (letter._spectrum < uVar10 && is_native_font) {
              resize(&letter,-100,-100,1,uVar10,0,2,0.0,0.0,0.0,0.0);
              uVar10 = this->_spectrum;
            }
            uVar5 = letter._spectrum;
            if (uVar10 < letter._spectrum) {
              uVar5 = uVar10;
            }
            if ((foreground_color != (uchar *)0x0) && (uVar5 != 0)) {
              uVar8 = 0;
              do {
                value = foreground_color[uVar8];
                if (value != '\x01') {
                  get_shared_channels(&local_50,&letter,(uint)uVar8,(uint)uVar8);
                  operator*=(&local_50,value);
                  if ((local_50._is_shared == false) && (local_50._data != (uchar *)0x0)) {
                    operator_delete__(local_50._data);
                  }
                }
                uVar8 = uVar8 + 1;
              } while (uVar5 != uVar8);
            }
            if ((int)(bVar1 | 0x100) < (int)font->_width) {
              if ((background_color != (uchar *)0x0) && (uVar5 != 0)) {
                uVar8 = 0;
                do {
                  draw_rectangle(this,iVar7,y0,0,(int)uVar8,letter._width + iVar7 + -1,
                                 letter._height + y0 + -1,0,(int)uVar8,background_color[uVar8],
                                 opacity);
                  uVar8 = uVar8 + 1;
                } while (uVar5 != uVar8);
              }
              draw_image<unsigned_char,unsigned_char>
                        (this,iVar7,y0,0,0,&letter,
                         (CImg<unsigned_char> *)
                         ((long)&font->_data->_width + (ulong)((bVar1 | 0x100) << 5)),opacity,255.0)
              ;
            }
            else {
              draw_image(this,iVar7,y0,0,0,&letter,opacity);
            }
            iVar7 = iVar7 + letter._width;
          }
          if ((letter._is_shared == false) && (letter._data != (uchar *)0x0)) {
            operator_delete__(letter._data);
          }
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != (sVar3 & 0xffffffff));
    }
    return this;
  }
  this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
  pcVar12 = "non-";
  if (this->_is_shared != false) {
    pcVar12 = "";
  }
  CImgArgumentException::CImgArgumentException
            (this_00,
             "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::draw_text(): Empty specified font.",
             (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
             this->_data,pcVar12,"unsigned char");
  __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
}

Assistant:

CImg<T>& _draw_text(const int x0, const int y0,
                        const char *const text,
                        const tc1 *const foreground_color, const tc2 *const background_color,
                        const float opacity, const CImgList<t>& font,
                        const bool is_native_font) {
      if (!text) return *this;
      if (!font)
        throw CImgArgumentException(_cimg_instance
                                    "draw_text(): Empty specified font.",
                                    cimg_instance);

      const unsigned int text_length = (unsigned int)std::strlen(text);
      const bool _is_empty = is_empty();
      if (_is_empty) {
        // If needed, pre-compute necessary size of the image
        int x = 0, y = 0, w = 0;
        unsigned char c = 0;
        for (unsigned int i = 0; i<text_length; ++i) {
          c = text[i];
          switch (c) {
          case '\n' : y+=font[0]._height; if (x>w) w = x; x = 0; break;
          case '\t' : x+=4*font[' ']._width; break;
          default : if (c<font._width) x+=font[c]._width;
          }
        }
        if (x!=0 || c=='\n') {
          if (x>w) w=x;
          y+=font[0]._height;
        }
        assign(x0+w,y0+y,1,is_native_font?1:font[0]._spectrum,0);
      }

      int x = x0, y = y0;
      for (unsigned int i = 0; i<text_length; ++i) {
        const unsigned char c = text[i];
        switch (c) {
        case '\n' : y+=font[0]._height; x = x0; break;
        case '\t' : x+=4*font[' ']._width; break;
        default : if (c<font._width) {
            CImg<T> letter = font[c];
            if (letter) {
              if (is_native_font && _spectrum>letter._spectrum) letter.resize(-100,-100,1,_spectrum,0,2);
              const unsigned int cmin = cimg::min(_spectrum,letter._spectrum);
              if (foreground_color) for (unsigned int c = 0; c<cmin; ++c) if (foreground_color[c]!=1) letter.get_shared_channel(c)*=foreground_color[c];
              if (c+256<font.width()) { // Letter has mask.
                if (background_color) for (unsigned int c = 0; c<cmin; ++c) draw_rectangle(x,y,0,c,x+letter._width-1,y+letter._height-1,0,c,background_color[c],opacity);
                draw_image(x,y,letter,font[c+256],opacity,(T)255);
              } else draw_image(x,y,letter,opacity); // Letter has no mask.
              x+=letter._width;
            }
          }
        }
      }
      return *this;
    }